

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O3

void __thiscall
TPZFileEqnStorage<long_double>::Store
          (TPZFileEqnStorage<long_double> *this,int ieq,int jeq,char *name)

{
  FILE *pFVar1;
  long lVar2;
  long *__ptr;
  long lVar3;
  int iVar4;
  double dVar5;
  int64_t fPos [5];
  double readvec [4] [100];
  double local_cf0;
  long local_ce8 [6];
  long local_cb8 [401];
  
  pFVar1 = fopen(name,"wb");
  local_ce8[2] = 0;
  local_ce8[3] = 0;
  local_ce8[0] = 0;
  local_ce8[1] = 0;
  local_ce8[4] = 0;
  lVar2 = ftell(pFVar1);
  fwrite(local_ce8,8,5,pFVar1);
  lVar3 = 0;
  __ptr = local_cb8;
  do {
    local_cb8[0] = ftell(pFVar1);
    fseek(pFVar1,lVar2 + lVar3 * 8,0);
    fwrite(__ptr,8,1,pFVar1);
    fseek(pFVar1,local_cb8[0],0);
    lVar3 = lVar3 + 1;
    dVar5 = 0.0;
    iVar4 = 100;
    do {
      local_cf0 = dVar5 * 2.1 * (double)(int)lVar3;
      fwrite(&local_cf0,8,1,pFVar1);
      dVar5 = dVar5 + 1.0;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  } while (lVar3 != 4);
  fclose(pFVar1);
  pFVar1 = fopen(name,"rb");
  fread(local_ce8,8,5,pFVar1);
  lVar2 = 0;
  do {
    fseek(pFVar1,local_ce8[lVar2],0);
    fread(__ptr,8,100,pFVar1);
    lVar2 = lVar2 + 1;
    __ptr = __ptr + 100;
  } while (lVar2 != 4);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Store(int ieq, int jeq, const char *name){
	//Initial tests with C input output files !
	int loop_limit=100;// = jeq-ieq;
	int i;
	FILE *out_file = fopen(name,"wb");
	double number=2.1;
	double val = 0;
	int64_t fPos[5] = {0};
	int64_t firstpos = ftell(out_file);
	fwrite(fPos,sizeof(int64_t),5,out_file);
	double readvec[4][100];
	int iblock =0;
	int64_t sizereturn;
	sizereturn = 0;
	for(iblock=0; iblock<4; iblock++) {
		int64_t currentpos = ftell(out_file);
		fseek(out_file,firstpos+iblock*sizeof(int64_t),SEEK_SET);
		fwrite(&currentpos,sizeof(int64_t),1,out_file);
		fseek(out_file,currentpos,SEEK_SET);
		for(i=0;i<loop_limit;i++){
			val=number*i*(iblock+1);
			fwrite(&val, sizeof(double), 1, out_file);
		}
	}
	fclose(out_file);
	out_file = fopen(name,"rb");
	sizereturn = fread(fPos,sizeof(int64_t),5,out_file);
#ifdef PZDEBUG
	if (sizereturn != 5) DebugStop();
#endif
	for(iblock = 0; iblock<4; iblock++) {
		fseek(out_file,fPos[iblock],SEEK_SET);
		sizereturn = fread(readvec[iblock],sizeof(double),loop_limit,out_file);
#ifdef PZDEBUG
		if (sizereturn != loop_limit) DebugStop();
#endif
	}
}